

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> __thiscall
bloaty::Bloaty::GetObjectFile(Bloaty *this,string *filename)

{
  pointer pOVar1;
  undefined8 in_RDX;
  undefined8 *in_RSI;
  _Head_base<0UL,_bloaty::ObjectFile_*,_false> in_RDI;
  unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> file;
  unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> *object_file;
  Arg *this_00;
  char *__str;
  int line;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff50;
  Arg *in_stack_ffffffffffffff68;
  string_view in_stack_ffffffffffffff70;
  unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 uVar2;
  char local_20 [32];
  
  __str = local_20;
  this_00 = (Arg *)in_RDI._M_head_impl;
  (**(code **)(*(long *)*in_RSI + 0x10))(__str,(long *)*in_RSI,in_RDX);
  uVar2 = 0;
  TryOpenELFFile((unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *)this);
  pOVar1 = std::unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_>::get
                     ((unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> *)
                      this_00);
  if (pOVar1 == (pointer)0x0) {
    TryOpenMachOFile(in_stack_ffffffffffffff88);
    std::unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_>::operator=
              ((unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> *)this_00,
               (unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> *)
               in_RDI._M_head_impl);
    std::unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_>::~unique_ptr
              ((unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> *)this_00);
  }
  pOVar1 = std::unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_>::get
                     ((unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> *)
                      this_00);
  if (pOVar1 == (pointer)0x0) {
    TryOpenWebAssemblyFile(in_stack_ffffffffffffff88);
    std::unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_>::operator=
              ((unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> *)this_00,
               (unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> *)
               in_RDI._M_head_impl);
    std::unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_>::~unique_ptr
              ((unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> *)this_00);
  }
  pOVar1 = std::unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_>::get
                     ((unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> *)
                      this_00);
  if (pOVar1 == (pointer)0x0) {
    TryOpenPEFile((unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *)
                  CONCAT17(uVar2,in_stack_ffffffffffffffd8));
    std::unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_>::operator=
              ((unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> *)this_00,
               (unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> *)
               in_RDI._M_head_impl);
    std::unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_>::~unique_ptr
              ((unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> *)this_00);
  }
  pOVar1 = std::unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_>::get
                     ((unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> *)
                      this_00);
  if (pOVar1 != (pointer)0x0) {
    std::unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_>::~unique_ptr
              ((unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *)
               in_stack_ffffffffffffff50);
    return (__uniq_ptr_data<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>,_true,_true>
           )(tuple<bloaty::ObjectFile_*,_std::default_delete<bloaty::ObjectFile>_>)
            in_RDI._M_head_impl;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff50,__str);
  line = (int)((ulong)__str >> 0x20);
  std::__cxx11::string::c_str();
  absl::substitute_internal::Arg::Arg(this_00,(Nullable<const_char_*>)in_RDI._M_head_impl);
  absl::Substitute_abi_cxx11_(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::__cxx11::string::c_str();
  Throw((char *)in_stack_ffffffffffffff50,line);
}

Assistant:

std::unique_ptr<ObjectFile> Bloaty::GetObjectFile(
    const std::string& filename) const {
  std::unique_ptr<InputFile> file(file_factory_.OpenFile(filename));
  auto object_file = TryOpenELFFile(file);

  if (!object_file.get()) {
    object_file = TryOpenMachOFile(file);
  }

  if (!object_file.get()) {
    object_file = TryOpenWebAssemblyFile(file);
  }

  if (!object_file.get()) {
    object_file = TryOpenPEFile(file);
  }

  if (!object_file.get()) {
    THROWF("unknown file type for file '$0'", filename.c_str());
  }

  return object_file;
}